

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogl_shader.c
# Opt level: O1

_Bool glsl_use_shader(ALLEGRO_SHADER *shader,ALLEGRO_DISPLAY *display,
                     _Bool set_projview_matrix_from_display)

{
  uint uVar1;
  int iVar2;
  ALLEGRO_OGL_EXTRAS *pAVar3;
  _Bool _Var4;
  GLenum e;
  char *pcVar5;
  long lVar6;
  GLint *pGVar7;
  ALLEGRO_OGL_VARLOCS *pAVar8;
  byte bVar9;
  
  bVar9 = 0;
  if ((display->flags & 4) == 0) {
    return false;
  }
  uVar1 = *(uint *)&shader[1].pixel_copy;
  glGetError();
  (*_al_glUseProgram)(uVar1);
  e = glGetError();
  if (e == 0) {
    pAVar3 = display->ogl_extras;
    pAVar3->program_object = uVar1;
    pGVar7 = (GLint *)((long)&shader[1].pixel_copy + 4);
    pAVar8 = &pAVar3->varlocs;
    for (lVar6 = 0x15; lVar6 != 0; lVar6 = lVar6 + -1) {
      pAVar8->pos_loc = *pGVar7;
      pGVar7 = pGVar7 + (ulong)bVar9 * -2 + 1;
      pAVar8 = (ALLEGRO_OGL_VARLOCS *)((long)pAVar8 + (ulong)bVar9 * -8 + 4);
    }
    if ((set_projview_matrix_from_display) &&
       (iVar2 = (display->ogl_extras->varlocs).projview_matrix_loc, -1 < iVar2)) {
      (*_al_glUniformMatrix4fv)(iVar2,1,'\0',(GLfloat *)&display->projview_transform);
    }
    _al_ogl_update_render_state(display);
    _Var4 = true;
  }
  else {
    _Var4 = _al_trace_prefix("shader",2,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/opengl/ogl_shader.c"
                             ,0xd5,"glsl_use_shader");
    if (_Var4) {
      pcVar5 = _al_gl_error_string(e);
      _al_trace_suffix("glUseProgram(%u) failed: %s\n",(ulong)uVar1,pcVar5);
    }
    display->ogl_extras->program_object = 0;
    _Var4 = false;
  }
  return _Var4;
}

Assistant:

static bool glsl_use_shader(ALLEGRO_SHADER *shader, ALLEGRO_DISPLAY *display,
   bool set_projview_matrix_from_display)
{
   ALLEGRO_SHADER_GLSL_S *gl_shader;
   GLuint program_object;
   GLenum err;

   if (!(display->flags & ALLEGRO_OPENGL)) {
      return false;
   }

   gl_shader = (ALLEGRO_SHADER_GLSL_S *)shader;
   program_object = gl_shader->program_object;

   glGetError(); /* clear error */
   glUseProgram(program_object);
   err = glGetError();
   if (err != GL_NO_ERROR) {
      ALLEGRO_WARN("glUseProgram(%u) failed: %s\n", program_object,
         _al_gl_error_string(err));
      display->ogl_extras->program_object = 0;
      return false;
   }

   display->ogl_extras->program_object = program_object;

   /* Copy variable locations. */
   display->ogl_extras->varlocs = gl_shader->varlocs;

   /* Optionally set projview matrix.  We skip this when it is known that the
    * matrices in the display are out of date and are about to be clobbered
    * itself.
    */
   if (set_projview_matrix_from_display) {
      _al_glsl_set_projview_matrix(
         display->ogl_extras->varlocs.projview_matrix_loc, &display->projview_transform);
   }

   /* Alpha testing may be done in the shader and so when a shader is
    * set the uniforms need to be synchronized.
    */
   _al_ogl_update_render_state(display);

   return true;
}